

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub-sub.c
# Opt level: O2

void ps_publish_content(uint8_t service,ps_event_t *event)

{
  uint8_t *component;
  pub_topic_t *ppVar1;
  ulong uVar2;
  uint uVar3;
  ndn_key_storage_t *component_00;
  pub_topic_t *userdata;
  long lVar4;
  ndn_time_ms_t nVar5;
  ndn_aes_key_t *pnVar6;
  ndn_name_t *pnVar7;
  ndn_ecc_prv_t *pnVar8;
  pub_topic_t *ppVar9;
  int iVar10;
  char *__format;
  ulong uVar11;
  int iVar12;
  undefined1 local_220 [8];
  ndn_name_t name;
  name_component_t tp_comp;
  uint32_t used_size;
  uint8_t service_local;
  
  tp_comp._43_1_ = service;
  if (m_has_initialized == '\0') {
    _ps_topics_init();
  }
  ndn_name_init((ndn_name_t *)local_220);
  component_00 = ndn_key_storage_get_instance();
  ndn_name_append_component((ndn_name_t *)local_220,(name_component_t *)component_00);
  iVar12 = 1;
  ndn_name_append_bytes_component((ndn_name_t *)local_220,&tp_comp.field_0x2b,1);
  ndn_name_append_string_component((ndn_name_t *)local_220,"DATA",4);
  userdata = _match_pub_topic(tp_comp._43_1_,false);
  if (userdata != (pub_topic_t *)0x0) {
LAB_0010698a:
    nVar5 = ndn_time_now_ms();
    userdata->last_update_tp = nVar5;
    ndn_name_append_component
              ((ndn_name_t *)local_220,
               component_00->self_identity[0].components +
               ((ulong)component_00->self_identity[0].components_size - 2));
    ndn_name_append_component
              ((ndn_name_t *)local_220,
               component_00->self_identity[0].components +
               ((ulong)component_00->self_identity[0].components_size - 1));
    ndn_name_append_bytes_component((ndn_name_t *)local_220,event->data_id,event->data_id_len);
    component = &name.components[9].size;
    name_component_from_timestamp((name_component_t *)component,userdata->last_update_tp);
    ndn_name_append_component((ndn_name_t *)local_220,(name_component_t *)component);
    m_measure_tp1 = ndn_time_now_us();
    tp_comp.value[0x20] = '\0';
    tp_comp.value[0x21] = '\0';
    tp_comp.value[0x22] = '\0';
    tp_comp.value[0x23] = '\0';
    pnVar6 = ndn_ac_get_key_for_service(userdata->service);
    uVar3 = ndn_gen_encrypted_payload
                      (event->payload,event->payload_len,pkt_encoding_buf,
                       (uint32_t *)(tp_comp.value + 0x20),pnVar6->key_id,(uint8_t *)0x0,0);
    m_measure_tp2 = ndn_time_now_us();
    printf("DEBUG: %s, L%d: ","ps_publish_content",0x276);
    printf("[PUB/SUB] PUB-CONTENT-DATA-AES-ENC: %lu\n");
    if (uVar3 == 0) {
      memset(userdata->cache,0,300);
      uVar3 = event->freshness_period;
      pnVar7 = ndn_key_storage_get_self_identity(tp_comp._43_1_);
      pnVar8 = ndn_key_storage_get_self_identity_key(tp_comp._43_1_);
      if (pnVar8 == (ndn_ecc_prv_t *)0x0 || pnVar7 == (ndn_name_t *)0x0) {
        printf("ERROR: %s, L%d: ","ps_publish_content",0x28c);
        printf("[PUB/SUB] Cannot find proper identity to sign");
        return;
      }
      uVar11 = 8000;
      if (uVar3 != 0) {
        uVar11 = (ulong)uVar3;
      }
      uVar3 = tlv_make_data(userdata->cache,300,(size_t *)&userdata->cache_size,7,0,local_220,8,
                            pkt_encoding_buf,9,(ulong)(uint)tp_comp.value._32_4_,4,uVar11,10,3,0xb,
                            pnVar7,0xc,pnVar8);
      if (uVar3 == 0) {
        printf("DEBUG: %s, L%d: ","ps_publish_content",0x29b);
        printf("[PUB/SUB] PUB-CONTENT-PKT-SIZE: %u Bytes\n",(ulong)userdata->cache_size);
        printf("INFO: %s: ","ps_publish_content");
        printf("[PUB/SUB] Content Data has been generated");
        putchar(10);
        ndn_name_print((ndn_name_t *)local_220);
        return;
      }
      printf("ERROR: %s, L%d: ","ps_publish_content",0x298);
      __format = "[PUB/SUB] Content Data cannot be generated. Error code: %d";
    }
    else {
      printf("ERROR: %s, L%d: ","ps_publish_content",0x27b);
      __format = "[PUB/SUB] Cannot encrypt content to publish. Error code: %d";
    }
    printf(__format,(ulong)uVar3);
    return;
  }
  lVar4 = 6;
  ppVar9 = (pub_topic_t *)&m_pub_sub_state.sub_topics[2].callback;
  while (lVar4 = lVar4 + -1, lVar4 != 0) {
    userdata = ppVar9 + 1;
    ppVar1 = ppVar9 + 1;
    ppVar9 = userdata;
    if (ppVar1->service == 0xff) goto LAB_00106937;
  }
  printf("INFO: %s: ","ps_publish_content");
  printf("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
  putchar(10);
  iVar10 = 0;
  uVar11 = m_pub_sub_state.pub_topics[0].last_update_tp;
  for (lVar4 = 0; lVar4 != 0x520; lVar4 = lVar4 + 0x148) {
    uVar2 = *(ulong *)((long)&m_pub_sub_state.pub_topics[1].last_update_tp + lVar4);
    if (uVar2 < uVar11) {
      iVar10 = iVar12;
      uVar11 = uVar2;
    }
    iVar12 = iVar12 + 1;
  }
  userdata = m_pub_sub_state.pub_topics + iVar10;
LAB_00106937:
  uVar3 = ndn_forwarder_register_name_prefix
                    ((ndn_name_t *)local_220,_on_subscription_interest,userdata);
  if (uVar3 != 0) {
    printf("ERROR: %s, L%d: ","ps_publish_content",0x25a);
    printf("[PUB/SUB] Cannot register prefix for newly published content. Error Code: %d",
           (ulong)uVar3);
  }
  userdata->service = tp_comp._43_1_;
  userdata->is_cmd = false;
  goto LAB_0010698a;
}

Assistant:

void
ps_publish_content(uint8_t service, const ps_event_t* event)
{
  if (!m_has_initialized)
    _ps_topics_init();

  int ret = 0;
  // Prefix FORMAT: /home/service/DATA
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "DATA", strlen("DATA"));

  // published on this topic before? update the cache
  pub_topic_t* topic = NULL;
  topic = _match_pub_topic(service, false);
  if (!topic) {
    for (int i = 0; i < 5; i++) {
      if (m_pub_sub_state.pub_topics[i].service == NDN_SD_NONE) {
        topic = &m_pub_sub_state.pub_topics[i];
        break;
      }
    }
    if (topic == NULL) {
      NDN_LOG_INFO("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      uint64_t min_last_tp = m_pub_sub_state.pub_topics[0].last_update_tp;
      int index = 0;
      for (int i = 1; i < 5; i++) {
        if (m_pub_sub_state.pub_topics[i].last_update_tp < min_last_tp) {
          min_last_tp = m_pub_sub_state.pub_topics[i].last_update_tp;
          index = i;
        }
      }
      topic = &m_pub_sub_state.pub_topics[index];
      // TODO: unregister the prefix registered by the old topic
    }
    // register the new prefix
    ret = ndn_forwarder_register_name_prefix(&name, _on_subscription_interest, topic);
    if (ret != NDN_SUCCESS) {
      NDN_LOG_ERROR("[PUB/SUB] Cannot register prefix for newly published content. Error Code: %d", ret);
    }
    topic->service = service;
    topic->is_cmd = false;
  }
  topic->last_update_tp = ndn_time_now_ms();
  // Append the last several component to the Data name
  // Data name FORMAT: /home/service/DATA/room/device-id/content-id/tp
  /* given that all self_identity have same <room> and <device-id>, this is fine */
  ndn_name_append_component(&name, &storage->self_identity[0].components[storage->self_identity[0].components_size - 2]);
  ndn_name_append_component(&name, &storage->self_identity[0].components[storage->self_identity[0].components_size - 1]);
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  name_component_t tp_comp;
  name_component_from_timestamp(&tp_comp, topic->last_update_tp);
  ndn_name_append_component(&name, &tp_comp);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // Encrypt payload
  uint32_t used_size = 0;
  ndn_aes_key_t* service_aes_key = ndn_ac_get_key_for_service(topic->service);
  ret = ndn_gen_encrypted_payload(event->payload, event->payload_len, pkt_encoding_buf, &used_size,
                                  service_aes_key->key_id, NULL, 0);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CONTENT-DATA-AES-ENC: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif


  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot encrypt content to publish. Error code: %d", ret);
    return;
  }

  memset(topic->cache, 0, sizeof(topic->cache));
  uint32_t default_freshness_period = 0;
  if (!event->freshness_period) {
    // this user does not define the freshness period, it will pick 8000ms as default
    default_freshness_period = 8000;
  }
  else {
    default_freshness_period = event->freshness_period;
  }
  // select identity key
  ndn_name_t* signing_identity = ndn_key_storage_get_self_identity(service);
  ndn_ecc_prv_t* signing_identity_key = ndn_key_storage_get_self_identity_key(service);
  if (signing_identity == NULL || signing_identity_key == NULL) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot find proper identity to sign");
    return;
  }
  ret = tlv_make_data(topic->cache, sizeof(topic->cache), (size_t *) &topic->cache_size, 7,
                      TLV_DATAARG_NAME_PTR, &name,
                      TLV_DATAARG_CONTENT_BUF, pkt_encoding_buf,
                      TLV_DATAARG_CONTENT_SIZE, used_size,
                      TLV_DATAARG_FRESHNESSPERIOD_U64, (uint64_t)default_freshness_period,
                      TLV_DATAARG_SIGTYPE_U8, NDN_SIG_TYPE_ECDSA_SHA256,
                      TLV_DATAARG_IDENTITYNAME_PTR, signing_identity,
                      TLV_DATAARG_SIGKEY_PTR, signing_identity_key);
  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Content Data cannot be generated. Error code: %d", ret);
    return;
  }
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CONTENT-PKT-SIZE: %u Bytes\n", topic->cache_size);
  NDN_LOG_INFO("[PUB/SUB] Content Data has been generated");
  NDN_LOG_INFO_NAME(&name);
}